

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontSpecsOf.hpp
# Opt level: O2

void __thiscall
sciplot::FontSpecsOf<sciplot::TicsSpecsMajor>::FontSpecsOf
          (FontSpecsOf<sciplot::TicsSpecsMajor> *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)this = pvVar1;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar1 + -0x28)) = vtt[1];
  (this->m_fontname)._M_dataplus._M_p = (pointer)&(this->m_fontname).field_2;
  (this->m_fontname)._M_string_length = 0;
  (this->m_fontname).field_2._M_local_buf[0] = '\0';
  (this->m_fontsize)._M_dataplus._M_p = (pointer)&(this->m_fontsize).field_2;
  (this->m_fontsize)._M_string_length = 0;
  (this->m_fontsize).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

FontSpecsOf<DerivedSpecs>::FontSpecsOf()
{}